

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O0

int coda_recognize_file(char *filename,int64_t *file_size,coda_format *file_format,
                       char **product_class,char **product_type,int *version)

{
  int iVar1;
  coda_product *local_50;
  coda_product *product;
  coda_product_definition *definition;
  int *version_local;
  char **product_type_local;
  char **product_class_local;
  coda_format *file_format_local;
  int64_t *file_size_local;
  char *filename_local;
  
  product = (coda_product *)0x0;
  definition = (coda_product_definition *)version;
  version_local = (int *)product_type;
  product_type_local = product_class;
  product_class_local = (char **)file_format;
  file_format_local = (coda_format *)file_size;
  file_size_local = (int64_t *)filename;
  iVar1 = open_file(filename,&local_50,0);
  if (iVar1 == 0) {
    iVar1 = coda_data_dictionary_find_definition_for_product
                      (local_50,(coda_product_definition **)&product);
    if (iVar1 == 0) {
      if (file_format_local != (coda_format *)0x0) {
        *(int64_t *)file_format_local = local_50->file_size;
      }
      if (product == (coda_product *)0x0) {
        if (product_class_local != (char **)0x0) {
          *(coda_format *)product_class_local = local_50->format;
        }
        if (product_type_local != (char **)0x0) {
          *product_type_local = (char *)0x0;
        }
        if (version_local != (int *)0x0) {
          version_local[0] = 0;
          version_local[1] = 0;
        }
        if (definition != (coda_product_definition *)0x0) {
          definition->format = ~coda_format_ascii;
        }
      }
      else {
        if (product_class_local != (char **)0x0) {
          *(undefined4 *)product_class_local = *(undefined4 *)&product->filename;
        }
        if (product_type_local != (char **)0x0) {
          *product_type_local = (char *)**(undefined8 **)(product[1].file_size + 0x28);
        }
        if (version_local != (int *)0x0) {
          *(undefined8 *)version_local = *(undefined8 *)product[1].file_size;
        }
        if (definition != (coda_product_definition *)0x0) {
          definition->format = *(coda_format *)((long)&product->filename + 4);
        }
      }
      coda_close(local_50);
      filename_local._4_4_ = 0;
    }
    else {
      coda_close(local_50);
      filename_local._4_4_ = -1;
    }
  }
  else {
    filename_local._4_4_ = -1;
  }
  return filename_local._4_4_;
}

Assistant:

LIBCODA_API int coda_recognize_file(const char *filename, int64_t *file_size, coda_format *file_format,
                                    const char **product_class, const char **product_type, int *version)
{
    coda_product_definition *definition = NULL;
    coda_product *product;

    if (open_file(filename, &product, 0) != 0)
    {
        return -1;
    }
    if (coda_data_dictionary_find_definition_for_product(product, &definition) != 0)
    {
        coda_close(product);
        return -1;
    }

    if (file_size != NULL)
    {
        *file_size = product->file_size;
    }
    if (definition == NULL)
    {
        if (file_format != NULL)
        {
            *file_format = product->format;
        }
        if (product_class != NULL)
        {
            *product_class = NULL;
        }
        if (product_type != NULL)
        {
            *product_type = NULL;
        }
        if (version != NULL)
        {
            *version = -1;
        }
    }
    else
    {
        if (file_format != NULL)
        {
            *file_format = definition->format;
        }
        if (product_class != NULL)
        {
            *product_class = definition->product_type->product_class->name;
        }
        if (product_type != NULL)
        {
            *product_type = definition->product_type->name;
        }
        if (version != NULL)
        {
            *version = definition->version;
        }
    }

    coda_close(product);

    return 0;
}